

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O0

int execute_filter_e8(rar_filter *filter,rar_virtual_machine *vm,size_t pos,int e9also)

{
  uint uVar1;
  uint uVar2;
  uint32_t uVar3;
  int32_t address;
  uint32_t currpos;
  uint32_t i;
  uint32_t filesize;
  uint32_t length;
  int e9also_local;
  size_t pos_local;
  rar_virtual_machine *vm_local;
  rar_filter *filter_local;
  
  uVar1 = filter->initialregisters[4];
  if ((uVar1 < 0x3c001) && (4 < uVar1)) {
    for (address = 0; (uint)address <= uVar1 - 5; address = address + 1) {
      if ((vm->memory[(uint)address] == 0xe8) ||
         ((e9also != 0 && (vm->memory[(uint)address] == 0xe9)))) {
        uVar2 = (int)pos + address + 1;
        uVar3 = vm_read_32(vm,(ulong)(address + 1));
        if (((int)uVar3 < 0) && ((uVar3 ^ 0xffffffff) + 1 <= uVar2)) {
          vm_write_32(vm,(ulong)(address + 1),uVar3 + 0x1000000);
        }
        else if ((-1 < (int)uVar3) && (uVar3 < 0x1000000)) {
          vm_write_32(vm,(ulong)(address + 1),uVar3 - uVar2);
        }
        address = address + 4;
      }
    }
    filter->filteredblockaddress = 0;
    filter->filteredblocklength = uVar1;
    filter_local._4_4_ = 1;
  }
  else {
    filter_local._4_4_ = 0;
  }
  return filter_local._4_4_;
}

Assistant:

static int
execute_filter_e8(struct rar_filter *filter, struct rar_virtual_machine *vm, size_t pos, int e9also)
{
  uint32_t length = filter->initialregisters[4];
  uint32_t filesize = 0x1000000;
  uint32_t i;

  if (length > PROGRAM_WORK_SIZE || length <= 4)
    return 0;

  for (i = 0; i <= length - 5; i++)
  {
    if (vm->memory[i] == 0xE8 || (e9also && vm->memory[i] == 0xE9))
    {
      uint32_t currpos = (uint32_t)pos + i + 1;
      int32_t address = (int32_t)vm_read_32(vm, i + 1);
      if (address < 0 && currpos >= (~(uint32_t)address + 1))
        vm_write_32(vm, i + 1, address + filesize);
      else if (address >= 0 && (uint32_t)address < filesize)
        vm_write_32(vm, i + 1, address - currpos);
      i += 4;
    }
  }

  filter->filteredblockaddress = 0;
  filter->filteredblocklength = length;

  return 1;
}